

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t pem2der(char *pem,size_t len,uchar *out)

{
  char *pcVar1;
  char *pcVar2;
  uchar *in_RDX;
  long in_RSI;
  char *in_RDI;
  bool bVar3;
  char *s2;
  char *s1;
  char *end;
  char *local_30;
  size_t local_8;
  
  pcVar1 = in_RDI + in_RSI;
  local_30 = strstr(in_RDI,"-----BEGIN");
  pcVar2 = strstr(in_RDI,"-----END");
  if (local_30 == (char *)0x0) {
    local_8 = 0;
  }
  else if (pcVar2 == (char *)0x0) {
    local_8 = 0;
  }
  else {
    local_30 = local_30 + 10;
    while( true ) {
      bVar3 = false;
      if (local_30 < pcVar1) {
        bVar3 = *local_30 != '-';
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    while( true ) {
      bVar3 = false;
      if (local_30 < pcVar1) {
        bVar3 = *local_30 == '-';
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    if (*local_30 == '\r') {
      local_30 = local_30 + 1;
    }
    if (*local_30 == '\n') {
      local_30 = local_30 + 1;
    }
    if ((local_30 < pcVar2) && (pcVar2 <= pcVar1)) {
      local_8 = base64_decode(local_30,(long)pcVar2 - (long)local_30,in_RDX);
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t pem2der(const char* pem, size_t len, unsigned char* out)
{
	const char* end = pem + len;
	const char* s1 = strstr(pem, "-----BEGIN");
	const char* s2 = strstr(pem, "-----END");

	if(s1 == NULL)
		return 0;

	if(s2 == NULL)
		return 0;

	s1 += 10;

	while(s1 < end && *s1 != '-')
		s1++;

	while(s1 < end && *s1 == '-')
		s1++;

	if(*s1 == '\r') s1++;
	if(*s1 == '\n') s1++;

	if(s2 <= s1 || s2 > end)
		return 0;

	return base64_decode(s1, (size_t)(s2 - s1), (unsigned char*)out);
}